

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void add_module_headers(path *dir,
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *headers)

{
  bool bVar1;
  type tVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  recursive_directory_iterator last;
  recursive_directory_iterator it;
  intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp> local_38;
  intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp> local_30;
  int local_28 [2];
  
  bVar1 = boost::filesystem::exists(dir);
  if (bVar1) {
    boost::filesystem::recursive_directory_iterator::recursive_directory_iterator
              ((recursive_directory_iterator *)&local_30,dir);
    local_38.px = (recur_dir_itr_imp *)0x0;
    while( true ) {
      tVar2 = boost::iterators::operator!=
                        ((iterator_facade<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                          *)&local_30,
                         (iterator_facade<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                          *)&local_38);
      if (!tVar2) break;
      boost::filesystem::recursive_directory_iterator::dereference
                ((recursive_directory_iterator *)&local_30);
      boost::filesystem::directory_entry::status((directory_entry *)local_28);
      if (local_28[0] != 3) {
        __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              boost::filesystem::recursive_directory_iterator::dereference
                        ((recursive_directory_iterator *)&local_30);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)headers,__v);
      }
      boost::filesystem::recursive_directory_iterator::increment
                ((recursive_directory_iterator *)&local_30);
    }
    boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr(&local_38);
    boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr(&local_30);
  }
  return;
}

Assistant:

static void add_module_headers( fs::path const & dir, std::set<std::string> & headers )
{
    if( fs::exists( dir ) )
    {
        fs::recursive_directory_iterator it( dir ), last;

        for( ; it != last; ++it )
        {
            if( it->status().type() == fs::directory_file )
            {
                continue;
            }

            headers.insert( it->path().generic_string() );
        }
    }
}